

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

_Bool create_GL_context(SWindowData *window_data)

{
  undefined8 *puVar1;
  long *in_RDI;
  GLint minorGLX;
  GLint majorGLX;
  SWindowData_X11 *window_data_x11;
  SWindowData_X11 *in_stack_00000038;
  int iVar2;
  int in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var3;
  
  puVar1 = (undefined8 *)*in_RDI;
  iVar2 = 0;
  glXQueryVersion(puVar1[1],&stack0xffffffffffffffe4,&stack0xffffffffffffffe0);
  if ((in_stack_ffffffffffffffe4 < 2) && (iVar2 < 2)) {
    fprintf(_stderr,"GLX 1.2 or greater is required.\n");
    XCloseDisplay(puVar1[1]);
    _Var3 = false;
  }
  else {
    _Var3 = setup_pixel_format(in_stack_00000038);
    if (_Var3) {
      glXMakeCurrent(puVar1[1],*puVar1,puVar1[4]);
      init_GL((SWindowData *)CONCAT44(in_stack_ffffffffffffffe4,iVar2));
      _Var3 = CheckGLExtension((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8)
                              );
      if (_Var3) {
        SwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC)glXGetProcAddress("glXSwapIntervalEXT");
        set_target_fps_aux();
      }
      _Var3 = true;
    }
    else {
      _Var3 = false;
    }
  }
  return _Var3;
}

Assistant:

bool
create_GL_context(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)
    SWindowData_Win *window_data_win = (SWindowData_Win *) window_data->specific;

    if (setup_pixel_format(window_data_win->hdc) == false)
        return false;

    window_data_win->hGLRC = wglCreateContext(window_data_win->hdc);
    wglMakeCurrent(window_data_win->hdc, window_data_win->hGLRC);
    init_GL(window_data);

    SwapIntervalEXT    = (PFNWGLSWAPINTERVALEXTPROC)    wglGetProcAddress("wglSwapIntervalEXT");
    GetSwapIntervalEXT = (PFNWGLGETSWAPINTERVALEXTPROC) wglGetProcAddress("wglGetSwapIntervalEXT");
    set_target_fps_aux();

    return true;

#elif defined(linux)
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    GLint majorGLX, minorGLX = 0;
    glXQueryVersion(window_data_x11->display, &majorGLX, &minorGLX);
    if (majorGLX <= 1 && minorGLX < 2) {
        fprintf(stderr, "GLX 1.2 or greater is required.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    else {
        //fprintf(stdout, "GLX version: %d.%d\n", majorGLX, minorGLX);
    }

    if (setup_pixel_format(window_data_x11) == false)
        return false;

    glXMakeCurrent(window_data_x11->display, window_data_x11->window, window_data_x11->context);

    //fprintf(stdout, "GL Vendor: %s\n", glGetString(GL_VENDOR));
    //fprintf(stdout, "GL Renderer: %s\n", glGetString(GL_RENDERER));
    //fprintf(stdout, "GL Version: %s\n", glGetString(GL_VERSION));
    //fprintf(stdout, "GL Shading Language: %s\n", glGetString(GL_SHADING_LANGUAGE_VERSION));

    init_GL(window_data);

    if (CheckGLExtension("GLX_EXT_swap_control")) {
        SwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC) glXGetProcAddress((const GLubyte *)"glXSwapIntervalEXT");
        set_target_fps_aux();
    }

    return true;
#endif
}